

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsDatastore.cc
# Opt level: O2

string * __thiscall
LongReadsDatastore::get_read_sequence_abi_cxx11_
          (string *__return_storage_ptr__,LongReadsDatastore *this,size_t readID)

{
  int iVar1;
  pointer pRVar2;
  __off_t __offset;
  long lVar3;
  ulong __nbytes;
  undefined8 uStack_40;
  char acStack_38 [15];
  allocator local_29;
  
  pRVar2 = (this->read_to_fileRecord).super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>.
           _M_impl.super__Vector_impl_data._M_start;
  __nbytes = (ulong)(pRVar2[readID].record_size + 1);
  lVar3 = -(__nbytes + 0xf & 0xfffffffffffffff0);
  __offset = pRVar2[readID].offset;
  iVar1 = this->fd;
  *(undefined8 *)((long)&uStack_40 + lVar3) = 0x1dbe8f;
  lseek(iVar1,__offset,0);
  iVar1 = this->fd;
  *(undefined8 *)((long)&uStack_40 + lVar3) = 0x1dbe9e;
  ::read(iVar1,acStack_38 + lVar3,__nbytes);
  *(undefined8 *)((long)&uStack_40 + lVar3) = 0x1dbead;
  std::__cxx11::string::string((string *)__return_storage_ptr__,acStack_38 + lVar3,&local_29);
  return __return_storage_ptr__;
}

Assistant:

std::string LongReadsDatastore::get_read_sequence(size_t readID) const {
    char buffer[read_to_fileRecord[readID].record_size+1];
    size_t read_offset_in_file=read_to_fileRecord[readID].offset;
    lseek(fd,read_offset_in_file,SEEK_SET);
    ::read(fd,buffer,sizeof(buffer));
    return std::string(buffer);
}